

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PendingListAppendVarint(PendingList **pp,sqlite3_int64 i)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  PendingList *pPVar5;
  long lVar6;
  PendingList *pOld;
  
  pOld = *pp;
  if (pOld == (PendingList *)0x0) {
    iVar4 = sqlite3_initialize();
    if (iVar4 != 0) {
      return 7;
    }
    pOld = (PendingList *)sqlite3Malloc(0x94);
    if (pOld == (PendingList *)0x0) {
      return 7;
    }
    pOld->nSpace = 100;
    pPVar5 = pOld + 1;
    pOld->aData = (char *)pPVar5;
    pOld->nData = 0;
    iVar4 = 0;
  }
  else {
    iVar4 = pOld->nData;
    iVar1 = pOld->nSpace;
    if (iVar1 < iVar4 + 0xb) {
      iVar4 = sqlite3_initialize();
      if (iVar4 == 0) {
        lVar6 = (long)iVar1 * 2;
        pOld = (PendingList *)sqlite3Realloc(pOld,lVar6 + 0x30);
        if (pOld != (PendingList *)0x0) {
          pOld->nSpace = (int)lVar6;
          pPVar5 = pOld + 1;
          pOld->aData = (char *)pPVar5;
          iVar4 = pOld->nData;
          goto LAB_001cdf23;
        }
      }
      sqlite3_free(*pp);
      iVar4 = 7;
      pOld = (PendingList *)0x0;
      goto LAB_001cdf64;
    }
    pPVar5 = (PendingList *)pOld->aData;
  }
LAB_001cdf23:
  lVar6 = 0;
  do {
    bVar3 = (byte)i;
    *(byte *)((long)&pPVar5->nData + lVar6 + iVar4) = bVar3 | 0x80;
    lVar6 = lVar6 + 1;
    bVar2 = 0x7f < (ulong)i;
    i = (ulong)i >> 7;
  } while (bVar2);
  *(byte *)((long)&pPVar5->nData + lVar6 + (long)iVar4 + -1) = bVar3;
  iVar4 = pOld->nData;
  pOld->nData = iVar4 + (int)lVar6;
  pOld->aData[lVar6 + iVar4] = '\0';
  iVar4 = 0;
LAB_001cdf64:
  *pp = pOld;
  return iVar4;
}

Assistant:

static int fts3PendingListAppendVarint(
  PendingList **pp,               /* IN/OUT: Pointer to PendingList struct */
  sqlite3_int64 i                 /* Value to append to data */
){
  PendingList *p = *pp;

  /* Allocate or grow the PendingList as required. */
  if( !p ){
    p = sqlite3_malloc64(sizeof(*p) + 100);
    if( !p ){
      return SQLITE_NOMEM;
    }
    p->nSpace = 100;
    p->aData = (char *)&p[1];
    p->nData = 0;
  }
  else if( p->nData+FTS3_VARINT_MAX+1>p->nSpace ){
    i64 nNew = p->nSpace * 2;
    p = sqlite3_realloc64(p, sizeof(*p) + nNew);
    if( !p ){
      sqlite3_free(*pp);
      *pp = 0;
      return SQLITE_NOMEM;
    }
    p->nSpace = (int)nNew;
    p->aData = (char *)&p[1];
  }

  /* Append the new serialized varint to the end of the list. */
  p->nData += sqlite3Fts3PutVarint(&p->aData[p->nData], i);
  p->aData[p->nData] = '\0';
  *pp = p;
  return SQLITE_OK;
}